

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign_x86_avx2::forward
          (ROIAlign_x86_avx2 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  pointer pMVar5;
  Mat *this_00;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  _func_int **pp_Var10;
  bool bVar11;
  _func_int *p_Var12;
  int iVar13;
  int iVar14;
  int iVar15;
  _func_int *p_Var16;
  long lVar17;
  float *pfVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar41 [12];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [64];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  undefined1 in_register_000015c4 [12];
  allocator_type local_10d;
  int local_10c;
  void *local_108;
  void *local_100;
  void *local_f8;
  long local_f0;
  void *local_e8;
  void *local_e0;
  void *local_d8;
  _func_int **local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ROIAlign_x86_avx2 *local_90;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  
  auVar41 = in_ZMM6._4_12_;
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = pMVar5->w;
  iVar19 = pMVar5->h;
  local_e8 = (void *)(ulong)(uint)pMVar5->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),pMVar5->c,
              pMVar5->elemsize,opt->blob_allocator);
  iVar13 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    p_Var12 = this->_vptr_ROIAlign_x86_avx2[-3];
    fVar30 = *(float *)(&this->field_0xd8 + (long)p_Var12);
    uVar2 = *pMVar5[1].data;
    uVar3 = *(undefined8 *)((long)pMVar5[1].data + 8);
    local_b8._0_4_ = fVar30 * (float)uVar2;
    local_b8._4_4_ = fVar30 * (float)((ulong)uVar2 >> 0x20);
    local_b8._8_4_ = fVar30 * 0.0;
    local_b8._12_4_ = fVar30 * 0.0;
    auVar27._0_4_ = (float)uVar3 * fVar30;
    auVar27._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar30;
    auVar27._8_4_ = fVar30 * 0.0;
    auVar27._12_4_ = fVar30 * 0.0;
    auVar27 = vsubps_avx(auVar27,local_b8);
    if ((&this->field_0xe0)[(long)p_Var12] == '\x01') {
      local_b8._0_4_ = (float)local_b8._0_4_ + -0.5;
      local_b8._4_4_ = local_b8._4_4_ + -0.5;
      local_b8._8_4_ = local_b8._8_4_ + -0.5;
      local_b8._12_4_ = local_b8._12_4_ + -0.5;
    }
    else {
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar27 = vmaxps_avx(auVar27,auVar36);
    }
    uVar4 = *(ulong *)(&this->field_0xd0 + (long)p_Var12);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar4;
    auVar36 = vcvtdq2ps_avx(auVar28);
    auVar28 = vrcpps_avx(auVar36);
    auVar34._0_4_ = auVar27._0_4_ * auVar28._0_4_;
    auVar34._4_4_ = auVar27._4_4_ * auVar28._4_4_;
    auVar34._8_4_ = auVar27._8_4_ * auVar28._8_4_;
    auVar34._12_4_ = auVar27._12_4_ * auVar28._12_4_;
    auVar27 = vfmsub213ps_fma(auVar36,auVar34,auVar27);
    local_c8 = vfnmadd213ps_fma(auVar27,auVar28,auVar34);
    iVar13 = (int)(uVar4 >> 0x20);
    local_90 = this;
    if (*(int *)(&this->field_0xe4 + (long)p_Var12) == 1) {
      local_a8 = vmovshdup_avx(local_c8);
      local_108 = (void *)CONCAT44(local_108._4_4_,iVar19);
      if (*(int *)(&this->field_0xdc + (long)p_Var12) < 1) {
        auVar27 = vroundss_avx(local_a8,local_a8,10);
        fVar30 = auVar27._0_4_;
        auVar27 = vroundss_avx(local_c8,local_c8,10);
        fVar38 = auVar27._0_4_;
      }
      else {
        fVar30 = (float)*(int *)(&this->field_0xdc + (long)p_Var12);
        fVar38 = fVar30;
      }
      iVar25 = (int)fVar30;
      iVar19 = (int)fVar38;
      local_f0 = (long)iVar25;
      local_10c = iVar14;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar13 * (long)(int)uVar4 * local_f0 * iVar19,&local_10d);
      auVar27 = vmovshdup_avx(local_b8);
      detectron2_pre_calc_for_bilinear_interpolate<float>
                ((int)local_108,local_10c,
                 *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86_avx2[-3]),(int)local_f0
                 ,iVar19,auVar27._0_4_,local_b8._0_4_,(float)local_a8._0_4_,(float)local_c8._0_4_,
                 (int)local_f0,iVar19,&pre_calc);
      if (0 < (int)local_e8) {
        iVar14 = 1;
        if (1 < iVar25 * iVar19) {
          iVar14 = iVar25 * iVar19;
        }
        local_d0 = (_func_int **)(pMVar5->cstep * pMVar5->elemsize);
        local_d8 = pMVar5->data;
        local_100 = (void *)(this_00->cstep * this_00->elemsize);
        local_e0 = this_00->data;
        pp_Var10 = this->_vptr_ROIAlign_x86_avx2;
        iVar13 = 0;
        if (0 < iVar19) {
          iVar13 = iVar19;
        }
        local_10c = iVar13 * iVar25;
        local_a8._0_8_ = pp_Var10;
        p_Var12 = pp_Var10[-3];
        pvVar6 = (void *)0x0;
        do {
          local_f8 = pvVar6;
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var12)) {
            lVar24 = (long)local_d0 * (long)local_f8;
            local_108 = (void *)((long)local_100 * (long)local_f8 + (long)local_e0);
            iVar15 = 0;
            iVar26 = 0;
            do {
              local_f0 = CONCAT44(local_f0._4_4_,iVar15);
              lVar17 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
              if (0 < lVar17) {
                lVar23 = 0;
                do {
                  if (iVar25 < 1) {
                    fVar30 = 0.0;
                  }
                  else {
                    fVar30 = 0.0;
                    iVar22 = 0;
                    iVar20 = iVar26;
                    do {
                      if (0 < iVar19) {
                        pfVar18 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar20].w1;
                        iVar21 = iVar19;
                        do {
                          auVar27 = vinsertps_avx(ZEXT416(*(uint *)((long)local_d8 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar18 + -4))->pos1 * 4 +
                                                                   lVar24)),
                                                  ZEXT416(*(uint *)((long)local_d8 +
                                                                   (long)(int)pfVar18[-3] * 4 +
                                                                   lVar24)),0x10);
                          auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)((long)local_d8 +
                                                                           (long)(int)pfVar18[-2] *
                                                                           4 + lVar24)),0x20);
                          auVar27 = vinsertps_avx(auVar27,ZEXT416(*(uint *)((long)local_d8 +
                                                                           (long)(int)pfVar18[-1] *
                                                                           4 + lVar24)),0x30);
                          auVar33._0_4_ = auVar27._0_4_ * *pfVar18;
                          auVar33._4_4_ = auVar27._4_4_ * pfVar18[1];
                          auVar33._8_4_ = auVar27._8_4_ * pfVar18[2];
                          auVar33._12_4_ = auVar27._12_4_ * pfVar18[3];
                          auVar27 = vhaddps_avx(auVar33,auVar33);
                          auVar27 = vhaddps_avx(auVar27,auVar27);
                          fVar30 = fVar30 + auVar27._0_4_;
                          pfVar18 = pfVar18 + 8;
                          iVar21 = iVar21 + -1;
                        } while (iVar21 != 0);
                      }
                      iVar22 = iVar22 + 1;
                      iVar20 = iVar20 + iVar13;
                    } while (iVar22 != iVar25);
                    iVar26 = iVar26 + local_10c;
                    this = local_90;
                  }
                  *(float *)((long)local_108 + lVar23 * 4) = fVar30 * (1.0 / (float)iVar14);
                  lVar23 = lVar23 + 1;
                  p_Var12 = pp_Var10[-3];
                  lVar17 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
                } while (lVar23 < lVar17);
              }
              local_108 = (void *)((long)local_108 + lVar17 * 4);
              iVar15 = iVar15 + 1;
            } while (iVar15 < *(int *)(&this->field_0xd4 + (long)p_Var12));
          }
          pvVar6 = (void *)((long)local_f8 + 1);
        } while ((void *)((long)local_f8 + 1) != local_e8);
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var12) != 0) {
        return 0;
      }
      bVar11 = 0 < *(int *)(&this->field_0xdc + (long)p_Var12);
      auVar31._0_4_ = (float)*(int *)(&this->field_0xdc + (long)p_Var12);
      auVar27 = vroundps_avx(local_c8,10);
      auVar35[1] = bVar11;
      auVar35[0] = bVar11;
      auVar35[2] = bVar11;
      auVar35[3] = bVar11;
      auVar35[4] = bVar11;
      auVar35[5] = bVar11;
      auVar35[6] = bVar11;
      auVar35[7] = bVar11;
      auVar35[8] = bVar11;
      auVar35[9] = bVar11;
      auVar35[10] = bVar11;
      auVar35[0xb] = bVar11;
      auVar35[0xc] = bVar11;
      auVar35[0xd] = bVar11;
      auVar35[0xe] = bVar11;
      auVar35[0xf] = bVar11;
      auVar36 = vpslld_avx(auVar35,0x1f);
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      auVar27 = vblendvps_avx(auVar27,auVar31,auVar36);
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,
                 (long)iVar13 * (long)(int)auVar27._4_4_ *
                 (long)(int)uVar4 * (long)(int)auVar27._0_4_,&local_10d);
      p_Var12 = this->_vptr_ROIAlign_x86_avx2[-3];
      auVar27 = vmovshdup_avx(local_c8);
      auVar36 = vmovshdup_avx(local_b8);
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar19,iVar14,*(int *)(&this->field_0xd4 + (long)p_Var12),
                 *(int *)(&this->field_0xd0 + (long)p_Var12),auVar36._0_4_,(float)local_b8._0_4_,
                 auVar27._0_4_,local_c8._0_4_,*(int *)(&this->field_0xdc + (long)p_Var12),&pre_calc)
      ;
      if (0 < (int)local_e8) {
        local_e0 = (void *)(pMVar5->cstep * pMVar5->elemsize);
        pvVar6 = pMVar5->data;
        sVar7 = this_00->cstep;
        sVar8 = this_00->elemsize;
        pvVar9 = this_00->data;
        auVar29._0_4_ = (float)iVar19;
        auVar29._4_12_ = auVar41;
        local_d0 = this->_vptr_ROIAlign_x86_avx2;
        auVar32._0_4_ = (float)iVar14;
        auVar32._4_12_ = auVar41;
        p_Var12 = local_d0[-3];
        local_100 = (void *)0x0;
        p_Var16 = p_Var12;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var16)) {
            lVar24 = (long)local_e0 * (long)local_100;
            local_f8 = (void *)(sVar7 * sVar8 * (long)local_100 + (long)pvVar9);
            iVar14 = 0;
            iVar19 = 0;
            do {
              lVar17 = (long)*(int *)(&this->field_0xd0 + (long)p_Var16);
              if (0 < lVar17) {
                auVar37._0_4_ = (float)iVar14;
                auVar37._4_12_ = in_register_000015c4;
                auVar28 = vfmadd213ss_fma(auVar37,auVar27,auVar36);
                local_d8 = (void *)CONCAT44(local_d8._4_4_,iVar14 + 1);
                auVar39._0_4_ = (float)(iVar14 + 1);
                auVar39._4_12_ = in_register_000015c4;
                auVar33 = vfmadd213ss_fma(auVar39,auVar27,auVar36);
                auVar28 = vmaxss_avx(auVar28,ZEXT816(0) << 0x40);
                auVar34 = vminss_avx(auVar29,auVar28);
                auVar28 = vmaxss_avx(auVar33,ZEXT816(0) << 0x40);
                auVar28 = vminss_avx(auVar29,auVar28);
                fVar30 = auVar34._0_4_;
                fVar38 = auVar28._0_4_;
                auVar28 = vroundss_avx(ZEXT416((uint)(fVar38 - fVar30)),
                                       ZEXT416((uint)(fVar38 - fVar30)),10);
                p_Var12 = p_Var16;
                lVar23 = 0;
                do {
                  auVar44._0_4_ = (float)(int)lVar23;
                  auVar44._4_12_ = in_register_000015c4;
                  auVar34 = vfmadd213ss_fma(auVar44,local_c8,local_b8);
                  lVar1 = lVar23 + 1;
                  auVar47._0_4_ = (float)(int)lVar1;
                  auVar47._4_12_ = in_register_000015c4;
                  auVar31 = vfmadd213ss_fma(auVar47,local_c8,local_b8);
                  auVar35 = ZEXT816(0) << 0x40;
                  auVar40 = ZEXT1664(auVar35);
                  auVar34 = vmaxss_avx(auVar34,auVar35);
                  auVar33 = vminss_avx(auVar32,auVar34);
                  auVar34 = vmaxss_avx(auVar31,auVar35);
                  auVar34 = vminss_avx(auVar34,auVar32);
                  fVar42 = auVar33._0_4_;
                  fVar46 = auVar34._0_4_;
                  if (*(int *)(&this->field_0xdc + (long)p_Var12) < 1) {
                    auVar34 = vroundss_avx(ZEXT416((uint)(fVar46 - fVar42)),
                                           ZEXT416((uint)(fVar46 - fVar42)),10);
                    fVar48 = auVar28._0_4_;
                    fVar43 = auVar34._0_4_;
                  }
                  else {
                    fVar48 = (float)*(int *)(&this->field_0xdc + (long)p_Var12);
                    fVar43 = fVar48;
                  }
                  iVar13 = (int)fVar48;
                  iVar25 = (int)fVar43;
                  if (0 < iVar13) {
                    local_f0 = CONCAT71(local_f0._1_7_,fVar46 <= fVar42);
                    local_10c = CONCAT31(local_10c._1_3_,fVar38 <= fVar30);
                    local_a8._0_8_ = lVar1;
                    iVar26 = 0;
                    iVar15 = 0;
                    if (0 < iVar25) {
                      iVar15 = iVar25;
                    }
                    local_108 = (void *)CONCAT44(local_108._4_4_,iVar19);
                    iVar20 = iVar19;
                    do {
                      if (0 < iVar25) {
                        pfVar18 = &pre_calc.
                                   super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar20].w1;
                        iVar22 = iVar25;
                        do {
                          auVar34 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)((PreCalc<float> *)
                                                                         (pfVar18 + -4))->pos1 * 4 +
                                                                   lVar24)),
                                                  ZEXT416(*(uint *)((long)pvVar6 +
                                                                   (long)(int)pfVar18[-3] * 4 +
                                                                   lVar24)),0x10);
                          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar18[-2] *
                                                                           4 + lVar24)),0x20);
                          auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)((long)pvVar6 +
                                                                           (long)(int)pfVar18[-1] *
                                                                           4 + lVar24)),0x30);
                          auVar45._0_4_ = auVar34._0_4_ * *pfVar18;
                          auVar45._4_4_ = auVar34._4_4_ * pfVar18[1];
                          auVar45._8_4_ = auVar34._8_4_ * pfVar18[2];
                          auVar45._12_4_ = auVar34._12_4_ * pfVar18[3];
                          auVar34 = vhaddps_avx(auVar45,auVar45);
                          auVar34 = vhaddps_avx(auVar34,auVar34);
                          auVar40 = ZEXT464((uint)(auVar40._0_4_ + auVar34._0_4_));
                          pfVar18 = pfVar18 + 8;
                          iVar22 = iVar22 + -1;
                        } while (iVar22 != 0);
                      }
                      auVar35 = auVar40._0_16_;
                      iVar26 = iVar26 + 1;
                      iVar20 = iVar20 + iVar15;
                    } while (iVar26 != iVar13);
                    iVar19 = iVar19 + iVar15 * iVar13;
                    this = local_90;
                  }
                  fVar43 = 0.0;
                  if (fVar38 > fVar30 && fVar46 > fVar42) {
                    fVar43 = auVar35._0_4_ / (float)(iVar25 * iVar13);
                  }
                  *(float *)((long)local_f8 + lVar23 * 4) = fVar43;
                  p_Var12 = local_d0[-3];
                  lVar17 = (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
                  lVar23 = lVar1;
                } while (lVar1 < lVar17);
              }
              iVar14 = iVar14 + 1;
              local_f8 = (void *)((long)local_f8 + lVar17 * 4);
              p_Var16 = p_Var12;
            } while (iVar14 < *(int *)(&this->field_0xd4 + (long)p_Var12));
          }
          local_100 = (void *)((long)local_100 + 1);
        } while (local_100 != local_e8);
      }
    }
    if (pre_calc.super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pre_calc.
                      super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pre_calc.
                            super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int ROIAlign_x86_avx2::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}